

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

int matchreg(match *res,reg *reg,easm_expr *expr,iasctx *ctx)

{
  char *__s;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ull num;
  int *piVar4;
  char *pcVar5;
  char *end;
  
  if (reg->specials != (sreg *)0x0) {
    piVar4 = &reg->specials->fmask;
    while (uVar2 = ((sreg *)(piVar4 + -5))->num, (long)(int)uVar2 != 0xffffffffffffffff) {
      if ((*piVar4 == 0) || ((*piVar4 & ~*ctx->varinfo->fmask) == 0)) {
        switch(piVar4[-1]) {
        case 0:
          if ((expr->type == EASM_EXPR_REG) &&
             (iVar1 = strcmp(expr->str,*(char **)(piVar4 + -3)), iVar1 == 0)) {
LAB_0024594a:
            iVar1 = setbf(res,reg->bf,(long)(int)uVar2);
            return iVar1;
          }
          break;
        case 1:
          if ((expr->type == EASM_EXPR_NUM) && (expr->num == 0)) goto LAB_0024594a;
          break;
        case 2:
          if ((expr->type == EASM_EXPR_NUM) && (expr->num == 1)) goto LAB_0024594a;
          break;
        case 3:
          if (expr->type == EASM_EXPR_DISCARD) goto LAB_0024594a;
        }
      }
      piVar4 = piVar4 + 6;
    }
  }
  uVar2 = 0;
  if (expr->type == EASM_EXPR_REG) {
    pcVar5 = expr->str;
    __s = reg->name;
    sVar3 = strlen(__s);
    iVar1 = strncmp(pcVar5,__s,sVar3);
    if (iVar1 == 0) {
      num = strtoull(pcVar5 + sVar3,&end,10);
      if (reg->hilo == 0) {
        pcVar5 = "";
        if (reg->suffix != (char *)0x0) {
          pcVar5 = reg->suffix;
        }
        iVar1 = strcmp(end,pcVar5);
        if (iVar1 != 0) {
          return 0;
        }
      }
      else {
        sVar3 = strlen(end);
        if (sVar3 != 1) {
          return 0;
        }
        if ((byte)(*end | 4U) != 0x6c) {
          return 0;
        }
        num = (ulong)(*end == 0x68) + num * 2;
      }
      if (reg->bf == (bitfield *)0x0) {
        uVar2 = (uint)(num == 0);
      }
      else {
        uVar2 = setbf(res,reg->bf,num);
      }
    }
  }
  return uVar2;
}

Assistant:

int matchreg (struct match *res, const struct reg *reg, const struct easm_expr *expr, struct iasctx *ctx) {
	if (reg->specials) {
		int i = 0;
		for (i = 0; reg->specials[i].num != -1; i++) {
			if (!var_ok(reg->specials[i].fmask, 0, ctx->varinfo))
				continue;
			switch (reg->specials[i].mode) {
				case SR_NAMED:
					if (expr->type == EASM_EXPR_REG && !strcmp(expr->str, reg->specials[i].name))
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_ZERO:
					if (expr->type == EASM_EXPR_NUM && expr->num == 0)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_ONE:
					if (expr->type == EASM_EXPR_NUM && expr->num == 1)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_DISCARD:
					if (expr->type == EASM_EXPR_DISCARD)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
			}
		}
	}
	if (expr->type != EASM_EXPR_REG)
		return 0;
	if (strncmp(expr->str, reg->name, strlen(reg->name)))
		return 0;
	const char *str = expr->str + strlen(reg->name);
	char *end;
	ull num = strtoull(str, &end, 10);
	if (!reg->hilo) {
		if (strcmp(end, (reg->suffix?reg->suffix:"")))
			return 0;
	} else {
		if (strlen(end) != 1)
			return 0;
		if (*end != 'h' && *end != 'l')
			return 0;
		num <<= 1;
		if (*end == 'h')
			num |= 1;
	}
	if (reg->bf)
		return setbf(res, reg->bf, num);
	else
		return !num;
}